

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::doAddCol(SPxLPBase<double> *this,LPColBase<double> *col,bool scale)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  bool bVar5;
  double dVar6;
  undefined7 in_register_00000011;
  double dVar7;
  int iVar8;
  long in_FS_OFFSET;
  int idx;
  double val;
  LPRowBase<double> empty;
  int local_b4;
  int local_b0;
  undefined4 local_ac;
  Item *local_a8;
  int local_9c;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  double local_78;
  DataKey local_70;
  LPRowBase<double> local_68;
  
  local_ac = (undefined4)CONCAT71(in_register_00000011,scale);
  local_b4 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_9c = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_68.left = -NAN;
  LPColSetBase<double>::add(&this->super_LPColSetBase<double>,(DataKey *)&local_68,col);
  if (this->thesense != MAXIMIZE) {
    pdVar3 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3[local_b4] = -pdVar3[local_b4];
  }
  local_a8 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
             (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[local_b4].idx;
  local_b0 = 0;
  if ((char)local_ac != '\0') {
    local_b0 = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,local_a8,&(this->super_LPRowSetBase<double>).scaleExp);
    local_98 = (this->super_LPColSetBase<double>).up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[local_b4];
    ::soplex::infinity::__tls_init();
    dVar7 = *(double *)(in_FS_OFFSET + -8);
    uStack_90 = 0;
    bVar5 = local_98 < dVar7;
    local_98 = dVar7;
    if (bVar5) {
      dVar7 = ldexp((this->super_LPColSetBase<double>).up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_b4],-local_b0);
      (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[local_b4] = dVar7;
    }
    local_80 = (this->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[local_b4];
    ::soplex::infinity::__tls_init();
    if (-local_98 < local_80) {
      dVar7 = ldexp((this->super_LPColSetBase<double>).low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_b4],-local_b0);
      (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[local_b4] = dVar7;
    }
    iVar2 = local_b0;
    dVar7 = ldexp((this->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[local_b4],local_b0);
    (this->super_LPColSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [local_b4] = dVar7;
    (this->super_LPColSetBase<double>).scaleExp.data[local_b4] = iVar2;
  }
  dVar7 = (double)(long)(local_a8->data).super_SVectorBase<double>.memused;
  if (0 < (long)dVar7) {
    do {
      dVar1 = (double)((long)dVar7 + -1);
      pNVar4 = (local_a8->data).super_SVectorBase<double>.m_elem;
      iVar2 = pNVar4[(long)dVar1].idx;
      local_98 = dVar1;
      if ((char)local_ac != '\0') {
        dVar6 = ldexp(pNVar4[(long)dVar1].val,
                      (this->super_LPRowSetBase<double>).scaleExp.data[iVar2] + local_b0);
        (local_a8->data).super_SVectorBase<double>.m_elem[(long)dVar1].val = dVar6;
      }
      local_78 = (local_a8->data).super_SVectorBase<double>.m_elem[(long)dVar1].val;
      if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
        LPRowBase<double>::LPRowBase(&local_68,0);
        iVar8 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar8 <= iVar2) {
          iVar8 = (iVar2 - iVar8) + 1;
          do {
            local_70.info = 0;
            local_70.idx = -1;
            LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&local_70,&local_68);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
        if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
          free(local_68.vec.theelem);
          local_68.vec.theelem = (Nonzero<double> *)0x0;
        }
      }
      SVSetBase<double>::add2
                ((SVSetBase<double> *)this,
                 (SVectorBase<double> *)
                 ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx),1
                 ,&local_b4,&local_78);
      bVar5 = 1 < (long)dVar7;
      dVar7 = local_98;
    } while (bVar5);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - local_9c));
  return;
}

Assistant:

void doAddCol(const LPColBase<R>& col, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(col);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      SVectorBase<R>& vec = colVector_w(idx);

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new column and existing row scaling factors to new values in ColSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }